

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O1

void __thiscall PKCS12Test_TestUnicode_Test::TestBody(PKCS12Test_TestUnicode_Test *this)

{
  Span<const_unsigned_char> der;
  string data;
  string local_28;
  
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs8/test/unicode_password.p12");
  der.size_ = local_28._M_string_length;
  der.data_ = (uchar *)local_28._M_dataplus._M_p;
  TestImpl("Unicode",der,kUnicodePassword,(char *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS12Test, TestUnicode) {
  // Generated with
  //   openssl pkcs12 -export -inkey ecdsa_p256_key.pem -in ecdsa_p256_cert.pem -password pass:"Hello, 世界"
  std::string data = GetTestData("crypto/pkcs8/test/unicode_password.p12");
  TestImpl("Unicode", bssl::StringAsBytes(data), kUnicodePassword, nullptr);
}